

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O0

void __thiscall
mjs::test_spec_runner::test_spec_runner
          (test_spec_runner *this,gc_heap *h,
          vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *specs,block_statement *statements
          )

{
  vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *h_00;
  version ver;
  source_extend *psVar1;
  anon_class_8_1_8991fb9c local_60;
  on_statement_executed_type local_58;
  block_statement *local_28;
  block_statement *statements_local;
  vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *specs_local;
  gc_heap *h_local;
  test_spec_runner *this_local;
  
  this->specs_ = specs;
  local_28 = statements;
  statements_local = (block_statement *)specs;
  specs_local = (vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *)h;
  h_local = (gc_heap *)this;
  psVar1 = syntax_node::extend((syntax_node *)statements);
  std::shared_ptr<mjs::source_file>::shared_ptr(&this->source_,&psVar1->file);
  h_00 = specs_local;
  ver = tested_version();
  local_60.this = this;
  std::function<void(mjs::statement_const&,mjs::completion_const&)>::
  function<mjs::test_spec_runner::test_spec_runner(mjs::gc_heap&,std::vector<mjs::test_spec,std::allocator<mjs::test_spec>>const&,mjs::block_statement_const&)::_lambda(mjs::statement_const&,mjs::completion_const&)_1_,void>
            ((function<void(mjs::statement_const&,mjs::completion_const&)> *)&local_58,&local_60);
  interpreter::interpreter(&this->i_,(gc_heap *)h_00,ver,&local_58);
  std::function<void_(const_mjs::statement_&,_const_mjs::completion_&)>::~function(&local_58);
  this->index_ = 0;
  this->last_line_ = 0;
  completion::completion(&this->last_result_,(value *)value::undefined,normal);
  return;
}

Assistant:

explicit test_spec_runner(gc_heap& h, const std::vector<test_spec>& specs, const block_statement& statements)
        : specs_(specs)
        , source_(statements.extend().file)
        , i_(h, tested_version(), [this](const statement& s, const completion& res) {
#ifdef TEST_SPEC_DEBUG
            std::wcout << pos_w << s.extend().start << "-" << pos_w << s.extend().end << ": ";
            print(std::wcout, s);
            std::wcout << " ==> " << debug_string(res.result) << "\n";
#endif
            if (s.extend().file == source_ && s.extend().start > last_line_) {
                check_test_spec_done(s.extend().start);
                last_result_ = res;
                last_line_ = s.extend().start;
            }
#if 0 // The stress test should be enabled, but this might still be relevant later on when debugging the GC
            h.garbage_collect(); // Run garbage collection after each statement to help catch bugs
#endif
        })
#ifdef TEST_SPEC_DEBUG
        , heap_(h)
#endif
    {
    }